

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  uint uVar4;
  CapTableBuilder *pCVar5;
  SegmentBuilder *this_00;
  char *pcVar6;
  word *pwVar7;
  word *pwVar8;
  int iVar9;
  ulong uVar10;
  SegmentBuilder **ppSVar11;
  char *condition;
  char *macroArgs;
  uint uVar12;
  OrphanBuilder *pOVar13;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *this_01;
  ElementSize oldSize;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  unsigned_short pointerCount;
  undefined2 uStack_36;
  unsigned_short dataSize;
  undefined2 uStack_32;
  
  uVar4 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value == 0 && uVar4 == 0) goto LAB_002ebea4;
  this_00 = this->segment;
  pCVar5 = this->capTable;
  if ((uVar4 & 3) == 2) {
    this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
    uVar4 = (uint)(this->tag).content;
    pwVar7 = (this_00->super_SegmentReader).ptr.ptr;
    uVar10 = (ulong)(uVar4 & 0xfffffff8);
    pOVar1 = (OrphanBuilder *)((long)&pwVar7->content + uVar10);
    pOVar13 = (OrphanBuilder *)((long)&pwVar7[1].content + uVar10);
    if ((uVar4 & 4) == 0) {
      pwVar7 = &pOVar13->tag + ((int)(pOVar1->tag).content >> 2);
      pOVar13 = pOVar1;
    }
    else {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(this_00->super_SegmentReader).arena,
                           (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
      pwVar7 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                       (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
    }
  }
  else {
    pwVar7 = this->location;
    pOVar13 = this;
  }
  if (this_00->readOnly == true) {
    SegmentBuilder::throwNotWritable(this_00);
  }
  _kjCondition.left = (Kind)(pOVar13->tag).content & OTHER;
  _kjCondition.right = LIST;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == LIST;
  if (_kjCondition.left != LIST) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x509,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Called getWritableListPointer() but existing pointer is not a list.\""
               ,&_kjCondition,
               (char (*) [85])
               "Schema mismatch: Called getWritableListPointer() but existing pointer is not a list."
              );
    kj::_::Debug::Fault::~Fault(&f);
    goto LAB_002ebea4;
  }
  uVar4 = *(uint *)((long)&(pOVar13->tag).content + 4);
  oldSize = (ElementSize)uVar4 & INLINE_COMPOSITE;
  if (oldSize != INLINE_COMPOSITE) {
    _dataSize = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)oldSize * 4);
    _pointerCount = (uint)(oldSize == POINTER);
    if (elementSize != BIT) {
      _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_43885;
      if (oldSize != BIT) {
        uVar12 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4);
        _kjCondition._0_8_ = &dataSize;
        if (_dataSize < uVar12) {
          pcVar6 = "dataSize >= dataBitsPerElement(elementSize) * ELEMENTS";
          iVar9 = 0x557;
        }
        else {
          _kjCondition._0_8_ = &pointerCount;
          uVar12 = (uint)(elementSize == POINTER);
          if (elementSize != POINTER || oldSize == POINTER) goto LAB_002ebc24;
          pcVar6 = "pointerCount >= pointersPerElement(elementSize) * ELEMENTS";
          iVar9 = 0x55b;
        }
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_24dbec;
        _kjCondition.op.content.ptr = (char *)(ulong)uVar12;
        this_01 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[73]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,iVar9,FAILED,pcVar6,
                   "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                   ,(DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                   (char (*) [73])
                   "Schema mismatch: Existing list value is incompatible with expected type.");
        goto LAB_002ebe92;
      }
      pcVar6 = "Schema mismatch: Found bit list where non-bit list was expected.";
      condition = "oldSize != ElementSize::BIT";
      macroArgs = 
      "_kjCondition,\"Schema mismatch: Found bit list where non-bit list was expected.\"";
      iVar9 = 0x553;
LAB_002ebd9d:
      _kjCondition._0_8_ = &oldSize;
      _kjCondition.result = true;
      _kjCondition._25_7_ = 0;
      _kjCondition.op.content.ptr = "ion failed\", info";
      this_01 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,iVar9,FAILED,condition,macroArgs,
                 (DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                 (char (*) [65])pcVar6);
      goto LAB_002ebe92;
    }
    _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3d166;
    if (oldSize != BIT) {
      pcVar6 = "Schema mismatch: Found non-bit list where bit list was expected.";
      condition = "oldSize == ElementSize::BIT";
      macroArgs = 
      "_kjCondition,\"Schema mismatch: Found non-bit list where bit list was expected.\"";
      iVar9 = 0x54e;
      goto LAB_002ebd9d;
    }
LAB_002ebc24:
    __return_storage_ptr__->segment = this_00;
    __return_storage_ptr__->capTable = pCVar5;
    __return_storage_ptr__->ptr = (byte *)pwVar7;
    __return_storage_ptr__->elementCount = uVar4 >> 3;
    __return_storage_ptr__->step = (uint)(oldSize == POINTER) * 0x40 + _dataSize;
    __return_storage_ptr__->structDataSize = _dataSize;
    __return_storage_ptr__->structPointerCount = (ushort)(oldSize == POINTER);
    __return_storage_ptr__->elementSize = oldSize;
    goto LAB_002ebc58;
  }
  uVar4 = (uint)pwVar7->content;
  _kjCondition.result = (uVar4 & 3) == 0;
  _kjCondition._0_8_ = (ulong)uVar4 & 0xffffffff00000003;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x518,FAILED,"tag->kind() == WirePointer::STRUCT",
               "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
               &_kjCondition,
               (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
    kj::_::Debug::Fault::fatal(&f);
  }
  ppSVar11 = (SegmentBuilder **)(pwVar7 + 1);
  uVar2 = *(ushort *)((long)&pwVar7->content + 4);
  _dataSize = CONCAT22(uStack_32,uVar2);
  uVar3 = *(ushort *)((long)&pwVar7->content + 6);
  _pointerCount = CONCAT22(uStack_36,uVar3);
  switch(elementSize) {
  case BIT:
    this_01 = &_kjCondition;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[123]>
              ((Fault *)this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x526,FAILED,(char *)0x0,
               "\"Schema mismatch: Found struct list where bit list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
               ,(char (*) [123])
                "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
              );
    break;
  case BYTE:
  case TWO_BYTES:
  case FOUR_BYTES:
  case EIGHT_BYTES:
    _kjCondition._0_8_ = &dataSize;
    if ((ulong)uVar2 != 0) goto switchD_002ebb1a_default;
    pcVar6 = "dataSize >= ONE * WORDS";
    iVar9 = 0x530;
LAB_002ebdda:
    _kjCondition.op.content.ptr = (char *)0x1;
    _kjCondition.result = true;
    _kjCondition._25_7_ = 0;
    _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_24dbec;
    this_01 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short&,unsigned_int>&,char_const(&)[73]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,iVar9,FAILED,pcVar6,
               "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
               ,(DebugComparison<unsigned_short_&,_unsigned_int> *)&_kjCondition,
               (char (*) [73])
               "Schema mismatch: Existing list value is incompatible with expected type.");
    break;
  case POINTER:
    _kjCondition._0_8_ = &pointerCount;
    if (uVar3 == 0) {
      pcVar6 = "pointerCount >= ONE * POINTERS";
      iVar9 = 0x537;
      goto LAB_002ebdda;
    }
    ppSVar11 = ppSVar11 + uVar2;
  default:
switchD_002ebb1a_default:
    __return_storage_ptr__->segment = this_00;
    __return_storage_ptr__->capTable = pCVar5;
    __return_storage_ptr__->ptr = (byte *)ppSVar11;
    __return_storage_ptr__->elementCount = uVar4 >> 2 & 0x1fffffff;
    __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
    __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
    __return_storage_ptr__->structPointerCount = uVar3;
    __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_002ebc58:
    iVar9 = 1;
    goto LAB_002ebe9e;
  case INLINE_COMPOSITE:
    kj::_::unreachable();
  }
LAB_002ebe92:
  kj::_::Debug::Fault::~Fault((Fault *)this_01);
  iVar9 = 4;
LAB_002ebe9e:
  if (iVar9 == 4) {
LAB_002ebea4:
    __return_storage_ptr__->ptr = (byte *)0x0;
    __return_storage_ptr__->elementCount = 0;
    __return_storage_ptr__->step = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
    __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
    __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
    __return_storage_ptr__->elementSize = elementSize;
    pwVar7 = (word *)0x0;
  }
  else {
    elementSize = __return_storage_ptr__->elementSize;
    pwVar7 = (word *)__return_storage_ptr__->ptr;
  }
  pwVar8 = pwVar7 + -1;
  if (pwVar7 == (word *)0x0) {
    pwVar8 = pwVar7;
  }
  if (elementSize != INLINE_COMPOSITE) {
    pwVar8 = pwVar7;
  }
  this->location = pwVar8;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asList(ElementSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  // (Actually, currently this is not true for primitive lists, but let's not turn into a bug if
  // it changes!)
  location = result.getLocation();

  return result;
}